

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O2

void expand_sha1(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                uint32_t len)

{
  long lVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  uint32_t key_len;
  long lVar4;
  uint8_t *puVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint32_t data_len;
  uint8_t *__dest;
  long lVar8;
  uint8_t *dst;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 uStack_80;
  uint8_t auStack_78 [8];
  uint8_t *local_70;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  uint32_t local_50;
  uint local_4c;
  uint8_t *local_48;
  uint8_t *local_40;
  uint32_t local_34;
  
  uStack_80 = 0x14;
  local_58 = (ulong)len / 0x14;
  local_4c = len % 0x14;
  uVar6 = (ulong)(infolen + 0x15);
  uVar10 = uVar6 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar10;
  dst = auStack_78 + lVar1;
  local_70 = okm;
  local_68 = uVar6;
  local_50 = len;
  local_48 = prk;
  local_40 = info;
  local_34 = prklen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x15fcd5;
  memset(dst,0,uVar6);
  puVar7 = local_40;
  __dest = (uint8_t *)((long)&local_68 + (4 - uVar10));
  local_40 = (uint8_t *)(ulong)infolen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x15fcf1;
  memcpy(__dest,puVar7,(ulong)infolen);
  local_60 = (ulong)(infolen + 1);
  lVar11 = local_58 * 0x14;
  lVar4 = 0;
  for (lVar8 = 0; uVar3 = local_50, data_len = (uint32_t)local_68, lVar11 - lVar8 != 0;
      lVar8 = lVar8 + 0x14) {
    __dest[(long)local_40] = (uint8_t)(lVar4 + 1);
    uVar3 = local_34;
    puVar7 = local_48;
    puVar5 = dst;
    if (lVar4 == 0) {
      data_len = (uint32_t)local_60;
      puVar5 = __dest;
    }
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x15fd3a;
    EverCrypt_HMAC_compute_sha1(dst,puVar7,uVar3,puVar5,data_len);
    *(undefined4 *)(local_70 + lVar8 + 0x10) = *(undefined4 *)((long)&local_68 + lVar1);
    uVar2 = *(undefined8 *)((long)&local_70 + lVar1);
    *(undefined8 *)(local_70 + lVar8) = *(undefined8 *)dst;
    *(undefined8 *)(local_70 + lVar8 + 8) = uVar2;
    lVar4 = lVar4 + 1;
  }
  uVar9 = (int)local_58 * 0x14;
  if (uVar9 < local_50) {
    __dest[(long)local_40] = (char)local_58 + '\x01';
    key_len = local_34;
    puVar7 = local_48;
    puVar5 = dst;
    if (uVar3 < 0x14) {
      data_len = (uint32_t)local_60;
      puVar5 = __dest;
    }
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x15fd9e;
    EverCrypt_HMAC_compute_sha1(dst,puVar7,key_len,puVar5,data_len);
    puVar7 = local_70 + uVar9;
    uVar6 = (ulong)local_4c;
    *(undefined8 *)((long)&uStack_80 + lVar1) = 0x15fdb3;
    memcpy(puVar7,dst,uVar6);
  }
  return;
}

Assistant:

static void
expand_sha1(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 20U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_sha1(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}